

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_vocoder.c
# Opt level: O1

void HTS_Vocoder_synthesize
               (HTS_Vocoder *v,size_t m,double lf0,double *spectrum,size_t nlpf,double *lpf,
               double alpha,double beta,double volume,double *rawdata,HTS_Audio *audio)

{
  bool bVar1;
  short data;
  uint uVar2;
  double *pdVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  size_t sVar7;
  ulong uVar8;
  long lVar9;
  double *pdVar10;
  ulong uVar11;
  ulong uVar12;
  uint m_00;
  int iVar13;
  long lVar14;
  double *pdVar15;
  double *pdVar16;
  ulong uVar17;
  double *pdVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  double dVar22;
  double dVar23;
  undefined1 auVar24 [16];
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  int local_c4;
  
  dVar25 = 0.0;
  if ((lf0 != -10000000000.0) || (NAN(lf0))) {
    if (lf0 <= 2.995732273553991) {
      dVar25 = v->rate / 20.0;
    }
    else {
      dVar25 = v->rate;
      if (9.903487552536127 <= lf0) {
        dVar25 = dVar25 / 20000.0;
      }
      else {
        dVar22 = exp(lf0);
        dVar25 = dVar25 / dVar22;
      }
    }
  }
  m_00 = (uint)m;
  if (v->is_first == '\x01') {
    v->pitch_of_curr_point = dVar25;
    v->pitch_counter = dVar25;
    v->pitch_inc_per_point = 0.0;
    if (nlpf == 0) {
      v->excite_ring_buff = (double *)0x0;
      v->excite_buff_size = 0;
      v->excite_buff_index = 0;
    }
    else {
      v->excite_buff_size = nlpf;
      pdVar3 = (double *)HTS_calloc(nlpf,8);
      v->excite_ring_buff = pdVar3;
      if (v->excite_buff_size != 0) {
        memset(pdVar3,0,v->excite_buff_size << 3);
      }
      v->excite_buff_index = 0;
    }
    pdVar3 = v->c;
    if (v->stage == 0) {
      HTS_mc2b(spectrum,pdVar3,m_00,alpha);
    }
    else {
      iVar5 = m_00 + 1;
      lVar4 = (long)iVar5;
      if (pdVar3 < spectrum) {
        if (iVar5 != 0) {
          lVar6 = 0;
          do {
            pdVar3[lVar6] = spectrum[lVar6];
            lVar6 = lVar6 + 1;
          } while (lVar4 != lVar6);
        }
      }
      else if (iVar5 != 0) {
        do {
          pdVar3[lVar4 + -1] = spectrum[lVar4 + -1];
          lVar4 = lVar4 + -1;
        } while (lVar4 != 0);
      }
      HTS_lsp2mgc(v,pdVar3,pdVar3,m_00,alpha);
      pdVar3 = v->c;
      if ((0 < (int)m_00) && ((alpha != 0.0 || (NAN(alpha))))) {
        dVar22 = pdVar3[m_00 & 0x7fffffff];
        lVar4 = (ulong)(m_00 & 0x7fffffff) + 1;
        do {
          dVar22 = dVar22 * -alpha + pdVar3[lVar4 + -2];
          pdVar3[lVar4 + -2] = dVar22;
          lVar4 = lVar4 + -1;
        } while (1 < lVar4);
      }
      HTS_gnorm(pdVar3,pdVar3,m_00,v->gamma);
      if (m != 0) {
        pdVar3 = v->c;
        sVar7 = 0;
        do {
          pdVar3[sVar7 + 1] = v->gamma * pdVar3[sVar7 + 1];
          sVar7 = sVar7 + 1;
        } while (m != sVar7);
      }
    }
    v->is_first = '\0';
  }
  if ((dVar25 != 0.0) || (NAN(dVar25))) {
    dVar22 = v->pitch_of_curr_point;
    if ((dVar22 != 0.0) || (NAN(dVar22))) {
      lVar4 = 0x50;
      dVar22 = (dVar25 - dVar22) /
               (((double)CONCAT44(0x45300000,(int)(v->fprd >> 0x20)) - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)v->fprd) - 4503599627370496.0));
      goto LAB_0017e1e0;
    }
  }
  v->pitch_inc_per_point = 0.0;
  v->pitch_of_curr_point = dVar25;
  lVar4 = 0x48;
  dVar22 = dVar25;
LAB_0017e1e0:
  *(double *)(&v->is_first + lVar4) = dVar22;
  if (v->stage == 0) {
    if ((1 < (int)m_00) && (0.0 < beta)) {
      uVar11 = (ulong)(m_00 & 0x7fffffff);
      if (v->postfilter_size < uVar11) {
        if (v->postfilter_buff != (double *)0x0) {
          HTS_free(v->postfilter_buff);
        }
        pdVar3 = (double *)HTS_calloc((ulong)(m_00 + 1),8);
        v->postfilter_buff = pdVar3;
        v->postfilter_size = uVar11;
      }
      HTS_mc2b(spectrum,v->postfilter_buff,m_00,alpha);
      dVar22 = HTS_b2en(v,v->postfilter_buff,m_00,alpha);
      pdVar3 = v->postfilter_buff;
      pdVar3[1] = pdVar3[1] - beta * alpha * pdVar3[2];
      if (1 < (int)m_00) {
        uVar8 = 2;
        do {
          pdVar3[uVar8] = pdVar3[uVar8] * (beta + 1.0);
          uVar8 = uVar8 + 1;
        } while (m_00 + 1 != uVar8);
      }
      dVar23 = HTS_b2en(v,pdVar3,m_00,alpha);
      dVar22 = log(dVar22 / dVar23);
      pdVar3 = v->postfilter_buff;
      *pdVar3 = dVar22 * 0.5 + *pdVar3;
      dVar22 = pdVar3[uVar11];
      spectrum[uVar11] = dVar22;
      lVar4 = uVar11 + 1;
      do {
        dVar23 = pdVar3[lVar4 + -2];
        spectrum[lVar4 + -2] = dVar22 * alpha + dVar23;
        lVar4 = lVar4 + -1;
        dVar22 = dVar23;
      } while (1 < lVar4);
    }
    HTS_mc2b(spectrum,v->cc,m_00,alpha);
    pdVar3 = v->c;
    pdVar15 = v->cc;
    sVar7 = v->fprd;
    pdVar18 = v->cinc;
    lVar4 = 0;
    do {
      pdVar18[lVar4] =
           (pdVar15[lVar4] - pdVar3[lVar4]) /
           (((double)CONCAT44(0x45300000,(int)(sVar7 >> 0x20)) - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)sVar7) - 4503599627370496.0));
      lVar4 = lVar4 + 1;
    } while (m + 1 != lVar4);
  }
  else {
    if ((1 < m) && (0.0 < beta)) {
      if (v->postfilter_size < m) {
        if (v->postfilter_buff != (double *)0x0) {
          HTS_free(v->postfilter_buff);
        }
        pdVar3 = (double *)HTS_calloc(m + 1,8);
        v->postfilter_buff = pdVar3;
        v->postfilter_size = m;
      }
      dVar22 = HTS_lsp2en(v,spectrum,m,alpha);
      pdVar3 = v->postfilter_buff;
      uVar11 = 0;
      do {
        if (uVar11 < m && 1 < uVar11) {
          dVar23 = spectrum[uVar11 - 1];
          dVar27 = spectrum[uVar11];
          dVar28 = (spectrum + uVar11)[1];
          dVar26 = (dVar27 - dVar23) * beta;
          dVar27 = (dVar28 - dVar27) * beta;
          dVar23 = (((dVar28 - dVar23) - (dVar27 + dVar26)) * dVar26 * dVar26) /
                   (dVar27 * dVar27 + dVar26 * dVar26) + dVar23 + dVar26;
        }
        else {
          dVar23 = spectrum[uVar11];
        }
        pdVar3[uVar11] = dVar23;
        uVar11 = uVar11 + 1;
      } while (m + 1 + (ulong)(m == 0xffffffffffffffff) != uVar11);
      pdVar3 = v->postfilter_buff;
      iVar5 = m_00 + 1;
      lVar4 = (long)iVar5;
      if (spectrum < pdVar3) {
        if (iVar5 != 0) {
          lVar6 = 0;
          do {
            spectrum[lVar6] = pdVar3[lVar6];
            lVar6 = lVar6 + 1;
          } while (lVar4 != lVar6);
        }
      }
      else if (iVar5 != 0) {
        do {
          spectrum[lVar4 + -1] = pdVar3[lVar4 + -1];
          lVar4 = lVar4 + -1;
        } while (lVar4 != 0);
      }
      dVar23 = HTS_lsp2en(v,spectrum,m,alpha);
      if ((dVar22 != dVar23) || (NAN(dVar22) || NAN(dVar23))) {
        dVar22 = dVar22 / dVar23;
        if (v->use_log_gain == '\0') {
          if (dVar22 < 0.0) {
            dVar22 = sqrt(dVar22);
          }
          else {
            dVar22 = SQRT(dVar22);
          }
          dVar22 = dVar22 * *spectrum;
        }
        else {
          dVar22 = log(dVar22);
          dVar22 = dVar22 * 0.5 + *spectrum;
        }
        *spectrum = dVar22;
      }
    }
    lVar4 = m + 1;
    auVar24._8_4_ = (int)((ulong)lVar4 >> 0x20);
    auVar24._0_8_ = lVar4;
    auVar24._12_4_ = 0x45300000;
    dVar22 = 0.7853981633974483 /
             ((auVar24._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0));
    lVar6 = 0;
    do {
      if (m < 2) {
        bVar1 = false;
      }
      else {
        sVar7 = 1;
        bVar1 = false;
        do {
          dVar23 = spectrum[sVar7];
          dVar27 = (spectrum + sVar7)[1];
          dVar28 = dVar27 - dVar23;
          if (dVar28 < dVar22) {
            dVar28 = dVar22 - dVar28;
            spectrum[sVar7] = dVar28 * -0.5 + dVar23;
            (spectrum + sVar7)[1] = dVar28 * 0.5 + dVar27;
            bVar1 = true;
          }
          sVar7 = sVar7 + 1;
        } while (m != sVar7);
      }
      if (spectrum[1] <= dVar22 && dVar22 != spectrum[1]) {
        spectrum[1] = dVar22;
        bVar1 = true;
      }
      if (3.141592653589793 - dVar22 < spectrum[m]) {
        spectrum[m] = 3.141592653589793 - dVar22;
        bVar1 = true;
      }
    } while ((bVar1) && (lVar6 = lVar6 + 1, lVar6 != 4));
    HTS_lsp2mgc(v,spectrum,v->cc,m_00,alpha);
    pdVar3 = v->cc;
    if ((0 < (int)m_00) && ((alpha != 0.0 || (NAN(alpha))))) {
      dVar22 = pdVar3[m_00 & 0x7fffffff];
      lVar6 = (ulong)(m_00 & 0x7fffffff) + 1;
      do {
        dVar22 = dVar22 * -alpha + pdVar3[lVar6 + -2];
        pdVar3[lVar6 + -2] = dVar22;
        lVar6 = lVar6 + -1;
      } while (1 < lVar6);
    }
    HTS_gnorm(pdVar3,pdVar3,m_00,v->gamma);
    if (m != 0) {
      pdVar3 = v->cc;
      sVar7 = 0;
      do {
        pdVar3[sVar7 + 1] = v->gamma * pdVar3[sVar7 + 1];
        sVar7 = sVar7 + 1;
      } while (m != sVar7);
    }
    pdVar3 = v->c;
    sVar7 = v->fprd;
    pdVar15 = v->cc;
    pdVar18 = v->cinc;
    lVar6 = 0;
    do {
      pdVar18[lVar6] =
           (pdVar15[lVar6] - pdVar3[lVar6]) /
           (((double)CONCAT44(0x45300000,(int)(sVar7 >> 0x20)) - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)sVar7) - 4503599627370496.0));
      lVar6 = lVar6 + 1;
    } while (lVar4 != lVar6);
  }
  if (v->fprd != 0) {
    dVar22 = 1.0 - alpha * alpha;
    lVar6 = (m << 0x20) + 0x100000000;
    lVar14 = lVar6 >> 0x20;
    iVar5 = m_00 + 2;
    uVar8 = m + 1 & 0xffffffff;
    lVar4 = (long)iVar5;
    lVar21 = uVar8 - 2;
    uVar11 = 0;
    local_c4 = 0;
    do {
      if (v->excite_buff_size == 0) {
        dVar23 = v->pitch_of_curr_point;
        if ((dVar23 != 0.0) || (NAN(dVar23))) {
          dVar28 = v->pitch_counter + 1.0;
          v->pitch_counter = dVar28;
          dVar27 = 0.0;
          if (dVar23 <= dVar28) {
            if (dVar23 < 0.0) {
              dVar27 = sqrt(dVar23);
            }
            else {
              dVar27 = SQRT(dVar23);
            }
            v->pitch_counter = v->pitch_counter - v->pitch_of_curr_point;
          }
          v->pitch_of_curr_point = v->pitch_inc_per_point + v->pitch_of_curr_point;
        }
        else {
          dVar27 = HTS_white_noise(v);
        }
      }
      else {
        dVar27 = HTS_white_noise(v);
        dVar23 = v->pitch_of_curr_point;
        if ((dVar23 != 0.0) || (NAN(dVar23))) {
          dVar26 = v->pitch_counter + 1.0;
          v->pitch_counter = dVar26;
          dVar28 = 0.0;
          if (dVar23 <= dVar26) {
            if (dVar23 < 0.0) {
              dVar28 = sqrt(dVar23);
            }
            else {
              dVar28 = SQRT(dVar23);
            }
            v->pitch_counter = v->pitch_counter - v->pitch_of_curr_point;
          }
          uVar17 = v->excite_buff_size;
          if (dVar27 != 0.0 && uVar17 != 0) {
            pdVar3 = v->excite_ring_buff;
            sVar7 = v->excite_buff_index;
            uVar19 = 0;
            do {
              uVar12 = (sVar7 + uVar19) % uVar17;
              uVar2 = 0x3ff00000;
              if (uVar17 - 1 >> 1 != uVar19) {
                uVar2 = 0;
              }
              pdVar3[uVar12] =
                   ((double)((ulong)uVar2 << 0x20) - lpf[uVar19]) * dVar27 + pdVar3[uVar12];
              uVar19 = uVar19 + 1;
            } while (uVar17 != uVar19);
          }
          if (dVar28 != 0.0 && uVar17 != 0) {
            pdVar3 = v->excite_ring_buff;
            sVar7 = v->excite_buff_index;
            uVar19 = 0;
            do {
              uVar12 = (sVar7 + uVar19) % uVar17;
              pdVar3[uVar12] = lpf[uVar19] * dVar28 + pdVar3[uVar12];
              uVar19 = uVar19 + 1;
            } while (uVar17 != uVar19);
          }
          dVar27 = v->pitch_inc_per_point;
          pdVar3 = &v->pitch_of_curr_point;
        }
        else {
          pdVar3 = v->excite_ring_buff +
                   ((v->excite_buff_size - 1 >> 1) + v->excite_buff_index) % v->excite_buff_size;
        }
        *pdVar3 = dVar27 + *pdVar3;
        sVar7 = v->excite_buff_index;
        dVar27 = v->excite_ring_buff[sVar7];
        v->excite_ring_buff[sVar7] = 0.0;
        uVar17 = sVar7 + 1;
        if (v->excite_buff_size <= sVar7 + 1) {
          uVar17 = 0;
        }
        v->excite_buff_index = uVar17;
      }
      if (v->stage == 0) {
        if ((dVar27 != 0.0) || (NAN(dVar27))) {
          dVar23 = exp(*v->c);
          dVar27 = dVar27 * dVar23;
        }
        pdVar3 = v->c;
        pdVar15 = v->d1;
        dVar23 = 0.0;
        lVar20 = 0;
        do {
          uVar17 = lVar20 + 5;
          dVar28 = pdVar15[lVar20 + 10] * dVar22 + pdVar15[lVar20 + 5] * alpha;
          pdVar15[lVar20 + 5] = dVar28;
          dVar28 = dVar28 * pdVar3[1];
          pdVar15[lVar20 + 0xb] = dVar28;
          dVar28 = dVar28 * HTS_pade[lVar20 + 0x14];
          dVar26 = dVar28;
          if ((uVar17 & 1) == 0) {
            dVar26 = -dVar28;
          }
          dVar27 = dVar27 + dVar26;
          dVar23 = dVar23 + dVar28;
          lVar20 = lVar20 + -1;
        } while (1 < uVar17);
        pdVar15[6] = dVar27;
        dVar23 = dVar23 + dVar27;
        pdVar18 = pdVar15 + lVar4 * 4 + 0xe;
        pdVar16 = pdVar15 + uVar8 + lVar4 * 4 + 0xc;
        dVar27 = 0.0;
        lVar20 = 0;
        uVar17 = 5;
        do {
          lVar9 = (uVar17 - 1) * lVar4;
          dVar28 = pdVar15[(long)(iVar5 * 5) + uVar17 + 0xb];
          pdVar15[lVar9 + 0xc] = dVar28;
          pdVar15[lVar9 + 0xd] = dVar28 * dVar22 + pdVar15[lVar9 + 0xd] * alpha;
          dVar28 = 0.0;
          if (1 < (int)m_00) {
            dVar28 = *(double *)((long)pdVar15 + lVar4 * -8 * lVar20 + lVar4 * 0x20 + 0x68);
            lVar9 = 0;
            do {
              dVar28 = (pdVar18[lVar9 + 1] - dVar28) * alpha + pdVar18[lVar9];
              pdVar18[lVar9] = dVar28;
              lVar9 = lVar9 + 1;
            } while (lVar21 != lVar9);
            dVar28 = 0.0;
            if (1 < (int)m_00) {
              lVar9 = 0;
              dVar28 = 0.0;
              do {
                dVar28 = dVar28 + pdVar18[lVar9] * pdVar3[lVar9 + 2];
                lVar9 = lVar9 + 1;
              } while (lVar21 != lVar9);
            }
          }
          pdVar10 = pdVar16;
          iVar13 = iVar5;
          if (0 < (int)m_00) {
            do {
              *pdVar10 = pdVar10[-1];
              iVar13 = iVar13 + -1;
              pdVar10 = pdVar10 + -1;
            } while (2 < iVar13);
          }
          (pdVar15 + (long)(iVar5 * 5) + 0xc)[uVar17] = dVar28;
          dVar28 = dVar28 * HTS_pade[uVar17 + 0xf];
          dVar26 = dVar28;
          if ((uVar17 & 1) == 0) {
            dVar26 = -dVar28;
          }
          dVar23 = dVar23 + dVar26;
          dVar27 = dVar27 + dVar28;
          lVar20 = lVar20 + 1;
          pdVar18 = pdVar18 + -lVar4;
          pdVar16 = pdVar16 + -lVar4;
          bVar1 = 1 < uVar17;
          uVar17 = uVar17 - 1;
        } while (bVar1);
        pdVar15[(long)(iVar5 * 5) + 0xc] = dVar23;
        dVar27 = dVar27 + dVar23;
      }
      else {
        pdVar3 = v->c;
        dVar27 = dVar27 * *pdVar3;
        uVar2 = (uint)v->stage;
        if (0 < (int)uVar2) {
          pdVar18 = v->d1;
          pdVar15 = pdVar18 + 1;
          uVar17 = 0;
          pdVar16 = pdVar18;
          do {
            dVar23 = pdVar18[uVar17 * lVar14];
            dVar28 = pdVar3[1] * dVar23;
            if (1 < (int)m_00) {
              dVar26 = *(double *)((long)pdVar18 + (lVar6 >> 0x1d) * uVar17);
              lVar20 = 0;
              do {
                dVar26 = (pdVar15[lVar20 + 1] - dVar26) * alpha + pdVar15[lVar20];
                pdVar15[lVar20] = dVar26;
                dVar28 = dVar28 + pdVar3[lVar20 + 2] * dVar26;
                lVar20 = lVar20 + 1;
              } while ((m & 0xffffffff) - 1 != lVar20);
            }
            lVar20 = (m & 0xffffffff) + 1;
            if (0 < (int)m_00) {
              do {
                pdVar16[lVar20 + -1] = pdVar16[lVar20 + -2];
                lVar20 = lVar20 + -1;
              } while (1 < lVar20);
            }
            dVar27 = dVar27 - dVar28;
            pdVar18[uVar17 * lVar14] = dVar23 * alpha + dVar22 * dVar27;
            uVar17 = uVar17 + 1;
            pdVar15 = pdVar15 + lVar14;
            pdVar16 = pdVar16 + lVar14;
          } while (uVar17 != (uVar2 & 0x7fffffff));
        }
      }
      dVar27 = dVar27 * volume;
      if (rawdata != (double *)0x0) {
        lVar20 = (long)local_c4;
        local_c4 = local_c4 + 1;
        rawdata[lVar20] = dVar27;
      }
      if (audio != (HTS_Audio *)0x0) {
        data = 0x7fff;
        if ((dVar27 <= 32767.0) && (data = -0x8000, -32768.0 <= dVar27)) {
          data = (short)(int)dVar27;
        }
        HTS_Audio_write(audio,data);
      }
      pdVar3 = v->c;
      pdVar15 = v->cinc;
      uVar17 = 0;
      do {
        pdVar3[uVar17] = pdVar15[uVar17] + pdVar3[uVar17];
        uVar17 = uVar17 + 1;
      } while (m + 1 != uVar17);
      uVar11 = uVar11 + 1;
    } while (uVar11 < v->fprd);
  }
  v->pitch_of_curr_point = dVar25;
  pdVar3 = v->c;
  pdVar15 = v->cc;
  iVar5 = m_00 + 1;
  lVar4 = (long)iVar5;
  if (pdVar3 < pdVar15) {
    if (iVar5 != 0) {
      lVar6 = 0;
      do {
        pdVar3[lVar6] = pdVar15[lVar6];
        lVar6 = lVar6 + 1;
      } while (lVar4 != lVar6);
    }
  }
  else if (iVar5 != 0) {
    do {
      pdVar3[lVar4 + -1] = pdVar15[lVar4 + -1];
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
  }
  return;
}

Assistant:

void HTS_Vocoder_synthesize(HTS_Vocoder * v, size_t m, double lf0, double *spectrum, size_t nlpf, double *lpf, double alpha, double beta, double volume, double *rawdata, HTS_Audio * audio)
{
   double x;
   int i, j;
   short xs;
   int rawidx = 0;
   double p;

   /* lf0 -> pitch */
   if (lf0 == LZERO)
      p = 0.0;
   else if (lf0 <= MIN_LF0)
      p = v->rate / MIN_F0;
   else if (lf0 >= MAX_LF0)
      p = v->rate / MAX_F0;
   else
      p = v->rate / exp(lf0);

   /* first time */
   if (v->is_first == TRUE) {
      HTS_Vocoder_initialize_excitation(v, p, nlpf);
      if (v->stage == 0) {      /* for MCP */
         HTS_mc2b(spectrum, v->c, m, alpha);
      } else {                  /* for LSP */
         HTS_movem(spectrum, v->c, m + 1);
         HTS_lsp2mgc(v, v->c, v->c, m, alpha);
         HTS_mc2b(v->c, v->c, m, alpha);
         HTS_gnorm(v->c, v->c, m, v->gamma);
         for (i = 1; i <= m; i++)
            v->c[i] *= v->gamma;
      }
      v->is_first = FALSE;
   }

   HTS_Vocoder_start_excitation(v, p);
   if (v->stage == 0) {         /* for MCP */
      HTS_Vocoder_postfilter_mcp(v, spectrum, m, alpha, beta);
      HTS_mc2b(spectrum, v->cc, m, alpha);
      for (i = 0; i <= m; i++)
         v->cinc[i] = (v->cc[i] - v->c[i]) / v->fprd;
   } else {                     /* for LSP */
      HTS_Vocoder_postfilter_lsp(v, spectrum, m, alpha, beta);
      HTS_check_lsp_stability(spectrum, m);
      HTS_lsp2mgc(v, spectrum, v->cc, m, alpha);
      HTS_mc2b(v->cc, v->cc, m, alpha);
      HTS_gnorm(v->cc, v->cc, m, v->gamma);
      for (i = 1; i <= m; i++)
         v->cc[i] *= v->gamma;
      for (i = 0; i <= m; i++)
         v->cinc[i] = (v->cc[i] - v->c[i]) / v->fprd;
   }

   for (j = 0; j < v->fprd; j++) {
      x = HTS_Vocoder_get_excitation(v, lpf);
      if (v->stage == 0) {      /* for MCP */
         if (x != 0.0)
            x *= exp(v->c[0]);
         x = HTS_mlsadf(x, v->c, m, alpha, PADEORDER, v->d1);
      } else {                  /* for LSP */
         if (!NGAIN)
            x *= v->c[0];
         x = HTS_mglsadf(x, v->c, m, alpha, v->stage, v->d1);
      }
      x *= volume;

      /* output */
      if (rawdata)
         rawdata[rawidx++] = x;
      if (audio) {
         if (x > 32767.0)
            xs = 32767;
         else if (x < -32768.0)
            xs = -32768;
         else
            xs = (short) x;
         HTS_Audio_write(audio, xs);
      }

      for (i = 0; i <= m; i++)
         v->c[i] += v->cinc[i];
   }

   HTS_Vocoder_end_excitation(v, p);
   HTS_movem(v->cc, v->c, m + 1);
}